

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
FastVector<unsigned_char_*,_false,_false>::grow
          (FastVector<unsigned_char_*,_false,_false> *this,uint newSize)

{
  uchar **ppuVar1;
  
  ppuVar1 = this->data;
  grow_no_destroy(this,newSize);
  if (ppuVar1 != (uchar **)0x0) {
    (*(code *)NULLC::dealloc)(ppuVar1);
    return;
  }
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}